

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_67::BinaryReaderIR::OnElseExpr(BinaryReaderIR *this)

{
  bool bVar1;
  Location local_80;
  IfExceptExpr *local_60;
  IfExceptExpr *if_except_expr;
  size_type local_50;
  anon_union_16_2_ecfd7102_for_Location_1 local_48;
  IfExpr *local_38;
  IfExpr *if_expr;
  Expr *local_28;
  Expr *expr;
  LabelNode *label;
  BinaryReaderIR *this_local;
  
  label = (LabelNode *)this;
  if_expr._4_4_ = TopLabelExpr(this,(LabelNode **)&expr,&local_28);
  bVar1 = Failed(if_expr._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (*(int *)&expr->_vptr_Expr == 3) {
      local_38 = cast<wabt::IfExpr,wabt::Expr>(local_28);
      GetLocation((Location *)&if_except_expr,this);
      (local_38->true_).end_loc.filename.data_ = (char *)if_except_expr;
      (local_38->true_).end_loc.filename.size_ = local_50;
      (local_38->true_).end_loc.field_1.field_1.offset = (size_t)local_48.field_1.offset;
      *(undefined8 *)((long)&(local_38->true_).end_loc.field_1 + 8) = local_48._8_8_;
      (expr->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)&local_38->false_;
      *(undefined4 *)&expr->_vptr_Expr = 4;
    }
    else {
      if (*(int *)&expr->_vptr_Expr != 5) {
        PrintError(this,"else expression without matching if");
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      local_60 = cast<wabt::IfExceptExpr,wabt::Expr>(local_28);
      GetLocation(&local_80,this);
      (local_60->true_).end_loc.filename.data_ = local_80.filename.data_;
      (local_60->true_).end_loc.filename.size_ = local_80.filename.size_;
      (local_60->true_).end_loc.field_1.field_1.offset = (size_t)local_80.field_1.field_1.offset;
      *(undefined8 *)((long)&(local_60->true_).end_loc.field_1 + 8) = local_80.field_1._8_8_;
      (expr->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)&local_60->false_;
      *(undefined4 *)&expr->_vptr_Expr = 6;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnElseExpr() {
  LabelNode* label;
  Expr* expr;
  CHECK_RESULT(TopLabelExpr(&label, &expr));

  if (label->label_type == LabelType::If) {
    auto* if_expr = cast<IfExpr>(expr);
    if_expr->true_.end_loc = GetLocation();
    label->exprs = &if_expr->false_;
    label->label_type = LabelType::Else;
  } else if (label->label_type == LabelType::IfExcept) {
    auto* if_except_expr = cast<IfExceptExpr>(expr);
    if_except_expr->true_.end_loc = GetLocation();
    label->exprs = &if_except_expr->false_;
    label->label_type = LabelType::IfExceptElse;
  } else {
    PrintError("else expression without matching if");
    return Result::Error;
  }

  return Result::Ok;
}